

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# input_buffer.hh
# Opt level: O2

void __thiscall
dtc::text_input_buffer::text_input_buffer
          (text_input_buffer *this,
          unique_ptr<dtc::input_buffer,_std::default_delete<dtc::input_buffer>_> *b,
          unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *d,vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *i,string *directory,FILE *deps)

{
  shared_ptr<dtc::input_buffer> local_40;
  
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                *)this,&d->_M_h);
  this->cursor = 0;
  std::
  stack<std::shared_ptr<dtc::input_buffer>,std::deque<std::shared_ptr<dtc::input_buffer>,std::allocator<std::shared_ptr<dtc::input_buffer>>>>
  ::
  stack<std::deque<std::shared_ptr<dtc::input_buffer>,std::allocator<std::shared_ptr<dtc::input_buffer>>>,void>
            (&this->input_stack);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->include_paths,i);
  std::__cxx11::string::string((string *)&this->dir,(string *)directory);
  this->depfile = deps;
  std::__shared_ptr<dtc::input_buffer,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<dtc::input_buffer,std::default_delete<dtc::input_buffer>,void>
            ((__shared_ptr<dtc::input_buffer,(__gnu_cxx::_Lock_policy)2> *)&local_40,b);
  std::deque<std::shared_ptr<dtc::input_buffer>,std::allocator<std::shared_ptr<dtc::input_buffer>>>
  ::emplace_back<std::shared_ptr<dtc::input_buffer>>
            ((deque<std::shared_ptr<dtc::input_buffer>,std::allocator<std::shared_ptr<dtc::input_buffer>>>
              *)&this->input_stack,&local_40);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_40.super___shared_ptr<dtc::input_buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount
            );
  return;
}

Assistant:

text_input_buffer(std::unique_ptr<input_buffer> &&b,
	                  std::unordered_set<std::string> &&d,
	                  std::vector<std::string> &&i,
	                  const std::string directory,
	                  FILE *deps)
		: defines(d), include_paths(i), dir(directory), depfile(deps)
	{
		input_stack.push(std::move(b));
	}